

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,ArrayPtr<const_char> *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,StringTree *rest_2,
          ArrayPtr<const_char> *rest_3,ArrayPtr<const_char> *rest_4,ArrayPtr<const_char> *rest_5,
          ArrayPtr<const_char> *rest_6,ArrayPtr<const_char> *rest_7,String *rest_8,
          ArrayPtr<const_char> *rest_9,ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,
          String *rest_12,ArrayPtr<const_char> *rest_13,CappedArray<char,_14UL> *rest_14,
          ArrayPtr<const_char> *rest_15,ArrayPtr<const_char> *rest_16,ArrayPtr<const_char> *rest_17,
          ArrayPtr<const_char> *rest_18)

{
  ArrayPtr<const_char> *pAVar1;
  char *pos_00;
  ArrayPtr<const_char> *rest_19;
  StringTree *rest_1_00;
  ArrayPtr<const_char> *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  ArrayPtr<const_char> *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  String *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  String *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  CappedArray<char,_14UL> *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  ArrayPtr<const_char> *rest_16_00;
  ArrayPtr<const_char> *rest_17_00;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pos_00 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_19 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::StringTree>(rest_2);
  rest_2_00 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::String>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::String>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::CappedArray<char,14ul>>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  rest_17_00 = fwd<kj::ArrayPtr<char_const>>(rest_18);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (this,pos_00,branchIndex,pAVar1,rest_19,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}